

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O0

void __thiscall
cm::uv_handle_deleter<uv_async_s>::operator()
          (uv_handle_deleter<uv_async_s> *this,uv_async_t *handle)

{
  element_type *__m;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  uv_async_t *handle_local;
  uv_handle_deleter<uv_async_s> *this_local;
  
  lock._M_device = (mutex_type *)handle;
  __m = std::__shared_ptr_access<std::mutex,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                  ((__shared_ptr_access<std::mutex,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this
                  );
  std::lock_guard<std::mutex>::lock_guard(&local_20,__m);
  handle_default_delete<uv_async_s>((uv_async_s *)lock._M_device);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void operator()(uv_async_t* handle)
  {
    std::lock_guard<std::mutex> lock(*handleMutex);
    handle_default_delete(handle);
  }